

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeLangevin.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeLangevin::applyConstraints(FluctuatingChargeLangevin *this)

{
  StuntDouble *in_RDI;
  RealType RVar1;
  RealType RVar2;
  RealType RVar3;
  int k;
  RealType oldFF;
  RealType velStep;
  RealType frictionForce;
  RealType randomForce;
  RealType cmass;
  RealType cfrc;
  RealType cvel;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  size_t *__urng;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  SimInfo *in_stack_ffffffffffffffa0;
  iterator *in_stack_ffffffffffffffa8;
  SimInfo *in_stack_ffffffffffffffb0;
  SimInfo *pSVar4;
  Atom *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  if ((in_RDI->globalIndex_ & 1) != 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_18);
    local_20 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffffb0,(MoleculeIterator *)in_stack_ffffffffffffffa8);
    while (local_20 != (Molecule *)0x0) {
      local_28 = Molecule::beginFluctuatingCharge
                           ((Molecule *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      while (local_28 != (Atom *)0x0) {
        __urng = &(in_RDI->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::
        __shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_RDI);
        std::normal_distribution<double>::operator()
                  ((normal_distribution<double> *)in_RDI,(RandNumGen *)__urng);
        StuntDouble::addFlucQFrc
                  ((StuntDouble *)in_stack_ffffffffffffffa0,
                   (RealType)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        RVar1 = StuntDouble::getFlucQVel(in_RDI);
        RVar2 = StuntDouble::getFlucQFrc(in_RDI);
        RVar3 = Atom::getChargeMass(local_28);
        in_stack_ffffffffffffffa8 =
             (iterator *)
             (RVar1 + (*(double *)&(in_RDI->properties_).propMap_._M_t._M_impl * RVar2) / RVar3);
        pSVar4 = (SimInfo *)0x0;
        for (in_stack_ffffffffffffff9c = 0; in_stack_ffffffffffffffb0 = pSVar4,
            in_stack_ffffffffffffff9c < in_RDI->globalIntegrableObjectIndex_;
            in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1) {
          in_stack_ffffffffffffffb0 =
               (SimInfo *)
               (-(double)(in_RDI->properties_)._vptr_PropertyMap * (double)in_stack_ffffffffffffffa8
               );
          in_stack_ffffffffffffffa8 =
               (iterator *)
               (RVar1 + (*(double *)&(in_RDI->properties_).propMap_._M_t._M_impl *
                        (RVar2 + (double)in_stack_ffffffffffffffb0)) / RVar3);
          in_stack_ffffffffffffffa0 = pSVar4;
          if (ABS((double)in_stack_ffffffffffffffb0 - (double)pSVar4) <=
              *(double *)&in_RDI->localIndex_) break;
          pSVar4 = in_stack_ffffffffffffffb0;
        }
        StuntDouble::addFlucQFrc
                  ((StuntDouble *)in_stack_ffffffffffffffa0,
                   (RealType)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        local_28 = Molecule::nextFluctuatingCharge
                             ((Molecule *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      local_20 = SimInfo::nextMolecule
                           (in_stack_ffffffffffffffb0,(MoleculeIterator *)in_stack_ffffffffffffffa8)
      ;
    }
    FluctuatingChargeConstraints::applyConstraints((FluctuatingChargeConstraints *)cfrc);
  }
  return;
}

Assistant:

void FluctuatingChargeLangevin::applyConstraints() {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cfrc, cmass, randomForce, frictionForce;
    RealType velStep, oldFF;  // used to test for convergence

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        randomForce = forceDistribution_(*randNumGen_);
        atom->addFlucQFrc(randomForce);

        // What remains contains velocity explicitly, but the velocity
        // required is at the full step: v(t + h), while we have
        // initially the velocity at the half step: v(t + h/2).  We
        // need to iterate to converge the friction force vector.

        // this is the velocity at the half-step:

        cvel = atom->getFlucQVel();

        // estimate velocity at full-step using everything but
        // friction forces:

        cfrc    = atom->getFlucQFrc();
        cmass   = atom->getChargeMass();
        velStep = cvel + dt2_ * cfrc / cmass;

        frictionForce = 0.0;

        // iteration starts here:

        for (int k = 0; k < maxIterNum_; k++) {
          oldFF         = frictionForce;
          frictionForce = -drag_ * velStep;
          // re-estimate velocities at full-step using friction forces:

          velStep = cvel + dt2_ * (cfrc + frictionForce) / cmass;

          // check for convergence

          if (fabs(frictionForce - oldFF) <= forceTolerance_)
            break;  // iteration ends here
        }
        atom->addFlucQFrc(frictionForce);
      }
    }
    fqConstraints_->applyConstraints();
  }